

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::junit_reporter::do_suite_complete(junit_reporter *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reporter *in_RDI;
  rep rVar4;
  undefined1 auVar5 [12];
  exception *e;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  tc;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
  *__range2;
  difference_type failures;
  ostream *in_stack_fffffffffffffdb8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  *in_stack_fffffffffffffdc0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  *in_stack_fffffffffffffdc8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  *in_stack_fffffffffffffdd0;
  undefined1 local_138 [8];
  string local_130 [72];
  string *in_stack_ffffffffffffff18;
  duration<double,_std::ratio<1L,_1L>_> local_d8 [12];
  exception_ptr local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_true>
  local_68;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *local_60;
  int local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_true>
  local_48;
  difference_type local_40;
  undefined4 local_34;
  undefined8 local_30;
  string local_28 [40];
  
  if ((in_RDI[1].os.super__Function_base._M_functor._M_pod_data[0xc] & 1U) != 0) {
    poVar2 = reporter::progress_stream(in_RDI);
    std::operator<<(poVar2,"\ngenerating JUnit report\n");
  }
  poVar2 = reporter::report_stream((reporter *)0x1f2a4e);
  std::operator<<(poVar2,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2a6a);
  poVar2 = std::operator<<(poVar2,"<testsuite name=\"");
  escape(in_stack_ffffffffffffff18);
  poVar2 = std::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"\" tests=\"");
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
          ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
                  *)0x1f2af0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string(local_28);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
                *)in_stack_fffffffffffffdb8);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
              *)in_stack_fffffffffffffdb8);
  local_40 = std::
             count_if<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,nonius::junit_reporter::result>,false,true>,nonius::junit_reporter::do_suite_complete()::_lambda(std::pair<std::__cxx11::string_const&,nonius::junit_reporter::result>const&)_1_>
                       (local_48._M_cur,local_50._M_cur);
  if (0 < local_40) {
    poVar2 = reporter::report_stream((reporter *)0x1f2b9a);
    poVar2 = std::operator<<(poVar2," errors=\"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    std::operator<<(poVar2,"\"");
  }
  poVar2 = reporter::report_stream((reporter *)0x1f2bfd);
  std::operator<<(poVar2,">\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2c19);
  std::operator<<(poVar2," <properties>\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2c35);
  poVar2 = std::operator<<(poVar2,"  <property name=\"samples\" value=\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&in_RDI[1]._vptr_reporter);
  std::operator<<(poVar2,"\">\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2c73);
  poVar2 = std::operator<<(poVar2,"  <property name=\"confidence_interval\" value=\"");
  local_58 = (int)std::setprecision(3);
  poVar2 = std::operator<<(poVar2,(_Setprecision)local_58);
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,*(double *)&in_RDI[1].os.super__Function_base._M_functor)
  ;
  std::operator<<(poVar2,"\">\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2ce0);
  poVar2 = std::operator<<(poVar2,"  <property name=\"resamples\" value=\"");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(int *)((long)&in_RDI[1].os.super__Function_base._M_functor + 8));
  std::operator<<(poVar2,"\">\n");
  poVar2 = reporter::report_stream((reporter *)0x1f2d1e);
  std::operator<<(poVar2," </properties>\n");
  local_60 = &in_RDI[3].os;
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
                *)in_stack_fffffffffffffdb8);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
              *)in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_68,&local_70);
    if (!bVar1) {
      poVar2 = reporter::report_stream((reporter *)0x1f31fc);
      std::operator<<(poVar2,"</testsuite>\n");
      poVar2 = reporter::report_stream((reporter *)0x1f3218);
      std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
      if ((in_RDI[1].os.super__Function_base._M_functor._M_pod_data[0xc] & 1U) != 0) {
        poVar2 = reporter::progress_stream(in_RDI);
        std::operator<<(poVar2,"done\n");
      }
      return;
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_false,_true>
                 *)0x1f2d98);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
    ::pair(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    poVar2 = reporter::report_stream((reporter *)0x1f2db5);
    poVar2 = std::operator<<(poVar2," <testcase name=\"");
    escape(in_stack_ffffffffffffff18);
    poVar2 = std::operator<<(poVar2,local_130);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string(local_130);
    bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_78);
    if (bVar1) break;
    poVar2 = reporter::report_stream((reporter *)0x1f311d);
    std::ostream::operator<<(poVar2,std::fixed);
    in_stack_fffffffffffffdd0 =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
          *)reporter::report_stream((reporter *)0x1f3144);
    std::ios_base::precision
              ((ios_base *)
               (&(in_stack_fffffffffffffdd0->first)._M_dataplus +
               *(long *)(*(long *)&in_stack_fffffffffffffdd0->first + -0x18)),0xf);
    in_stack_fffffffffffffdc8 =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
          *)reporter::report_stream((reporter *)0x1f3171);
    in_stack_fffffffffffffdc0 =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
          *)std::operator<<((ostream *)in_stack_fffffffffffffdc8," time=\"");
    rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_d8);
    in_stack_fffffffffffffdb8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffdc0,rVar4)
    ;
    std::operator<<(in_stack_fffffffffffffdb8,"\" />\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
    ::~pair(in_stack_fffffffffffffdc0);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_false,_true>
                  *)in_stack_fffffffffffffdc0);
  }
  poVar2 = reporter::report_stream((reporter *)0x1f2e55);
  std::operator<<(poVar2,">\n");
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)in_stack_fffffffffffffdc0,(exception_ptr *)in_stack_fffffffffffffdb8);
  auVar5 = std::rethrow_exception((exception_ptr)local_138);
  local_34 = auVar5._8_4_;
  local_30 = auVar5._0_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  ::~pair(in_stack_fffffffffffffdc0);
  _Unwind_Resume(local_30);
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating JUnit report\n";

            report_stream() << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
            report_stream() << "<testsuite name=\"" << escape(title) << "\" tests=\"" << data.size() << "\"";
            auto failures = std::count_if(data.begin(), data.end(),
                    [](std::pair<std::string const&, result> const& p) {
                        return static_cast<bool>(p.second.failure);
                    });
            if(failures > 0) report_stream() << " errors=\"" << failures << "\"";
            report_stream() << ">\n";

            report_stream() << " <properties>\n";
            report_stream() << "  <property name=\"samples\" value=\"" << n_samples << "\">\n";
            report_stream() << "  <property name=\"confidence_interval\" value=\"" << std::setprecision(3) << confidence_interval << "\">\n";
            report_stream() << "  <property name=\"resamples\" value=\"" << resamples << "\">\n";
            report_stream() << " </properties>\n";

            for(auto tc : data) {
                report_stream() << " <testcase name=\"" << escape(tc.first) << "\"";
                if(tc.second.failure) {
                    report_stream() << ">\n";
                    try {
                        std::rethrow_exception(tc.second.failure);
                    } catch(std::exception const& e) {
                        report_stream() << "  <error message=\"" << escape(e.what()) << "\" />\n";
                    } catch(...) {
                        report_stream() << "  <error message=\"unknown error\" />\n";
                    }
                    report_stream() << " </testcase>\n";
                } else {
                    report_stream() << std::fixed;
                    report_stream().precision(std::numeric_limits<double>::digits10);
                    report_stream() << " time=\"" << tc.second.analysis.mean.point.count() << "\" />\n";
                }
            }

            report_stream() << "</testsuite>\n";

            report_stream() << std::flush;

            if(verbose) progress_stream() << "done\n";
        }